

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_adaptor.cpp
# Opt level: O0

void __thiscall
nivalis::ImGuiDrawListGraphicsAdaptor::image
          (ImGuiDrawListGraphicsAdaptor *this,float x,float y,float w,float h,char *data_rgb,
          int cols,int rows)

{
  ImVec2 *p_max;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  ImVec2 *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  GLuint image_texture;
  ImVec2 uv_min;
  ImVec2 *in_stack_ffffffffffffffb0;
  ImTextureID in_stack_ffffffffffffffb8;
  ImDrawList *in_stack_ffffffffffffffc0;
  float in_stack_ffffffffffffffd0;
  uint local_2c;
  undefined4 local_28;
  undefined4 local_24;
  undefined8 local_20;
  float local_18;
  float local_14;
  float local_10;
  float local_c;
  
  local_28 = in_ECX;
  local_24 = in_EDX;
  local_20 = in_RSI;
  local_18 = in_XMM3_Da;
  local_14 = in_XMM2_Da;
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  glGenTextures(1,&local_2c);
  glBindTexture(0xde1,local_2c);
  glTexParameteri(0xde1,0x2801,0x2600);
  glTexParameteri(0xde1,0x2800,0x2601);
  glTexParameteri(0xde1,0x2802,0x812f);
  glTexParameteri(0xde1,0x2803,0x812f);
  glTexImage2D(0xde1,0,0x1907,local_24,local_28,0,0x1907,0x1401,local_20);
  uv_min = *in_RDI;
  p_max = (ImVec2 *)(ulong)local_2c;
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffcc,local_c,local_10);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc4,local_c + local_14,local_10 + local_18);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffbc,0.0,0.0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffb4,1.0,1.0);
  ImDrawList::AddImage
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,p_max,
             (ImVec2 *)uv_min,in_RDI,(ImU32)in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void ImGuiDrawListGraphicsAdaptor::image(float x, float y, float w, float h,
                                         char* data_rgb, int cols, int rows) {
    GLuint image_texture;
    glGenTextures(1, &image_texture);
    glBindTexture(GL_TEXTURE_2D, image_texture);

    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);

    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB, cols, rows, 0, GL_RGB,
                 GL_UNSIGNED_BYTE, data_rgb);
    draw_list->AddImage((void*)(intptr_t)image_texture, ImVec2(x, y),
                        ImVec2(x + w, y + h));
}